

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O0

void __thiscall
S2CrossingEdgeQuery::GetCandidates
          (S2CrossingEdgeQuery *this,S2Point *a0,S2Point *a1,S2Shape *shape,
          vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *edges)

{
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *pvVar1;
  S2Shape *a1_00;
  S2Point *a0_00;
  size_type sVar2;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  local_b0;
  const_iterator local_a8;
  ShapeEdgeId *local_a0;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  local_98;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  local_90;
  const_iterator local_88;
  ShapeEdgeId *local_80;
  __normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
  local_78;
  anon_class_8_1_a7d83976 local_60;
  ShapeEdgeIdVisitor local_58;
  int local_34;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *pvStack_30;
  int num_edges;
  vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *edges_local;
  S2Shape *shape_local;
  S2Point *a1_local;
  S2Point *a0_local;
  S2CrossingEdgeQuery *this_local;
  
  pvStack_30 = edges;
  edges_local = (vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_> *)shape
  ;
  shape_local = (S2Shape *)a1;
  a1_local = a0;
  a0_local = (S2Point *)this;
  std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::clear(edges);
  local_34 = (*(code *)(edges_local->
                       super__Vector_base<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>
                       )._M_impl.super__Vector_impl_data._M_start[2])();
  if (local_34 < 0x1c) {
    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::reserve
              (pvStack_30,(long)local_34);
  }
  a0_00 = a1_local;
  a1_00 = shape_local;
  pvVar1 = edges_local;
  local_60.edges = pvStack_30;
  std::function<bool(s2shapeutil::ShapeEdgeId_const&)>::
  function<S2CrossingEdgeQuery::GetCandidates(Vector3<double>const&,Vector3<double>const&,S2Shape_const&,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>*)::__0,void>
            ((function<bool(s2shapeutil::ShapeEdgeId_const&)> *)&local_58,&local_60);
  VisitRawCandidates(this,a0_00,(S2Point *)a1_00,(S2Shape *)pvVar1,&local_58);
  std::function<bool_(const_s2shapeutil::ShapeEdgeId_&)>::~function(&local_58);
  sVar2 = std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::size
                    (pvStack_30);
  if (1 < sVar2) {
    local_78._M_current =
         (ShapeEdgeId *)
         std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::begin
                   (pvStack_30);
    local_80 = (ShapeEdgeId *)
               std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::end
                         (pvStack_30);
    std::
    sort<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>>
              (local_78,(__normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                         )local_80);
    pvVar1 = pvStack_30;
    local_98._M_current =
         (ShapeEdgeId *)
         std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::begin
                   (pvStack_30);
    local_a0 = (ShapeEdgeId *)
               std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::end
                         (pvStack_30);
    local_90 = std::
               unique<__gnu_cxx::__normal_iterator<s2shapeutil::ShapeEdgeId*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>>
                         (local_98,(__normal_iterator<s2shapeutil::ShapeEdgeId_*,_std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>_>
                                    )local_a0);
    __gnu_cxx::
    __normal_iterator<s2shapeutil::ShapeEdgeId_const*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>
    ::__normal_iterator<s2shapeutil::ShapeEdgeId*>
              ((__normal_iterator<s2shapeutil::ShapeEdgeId_const*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>
                *)&local_88,&local_90);
    local_b0._M_current =
         (ShapeEdgeId *)
         std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::end
                   (pvStack_30);
    __gnu_cxx::
    __normal_iterator<s2shapeutil::ShapeEdgeId_const*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>
    ::__normal_iterator<s2shapeutil::ShapeEdgeId*>
              ((__normal_iterator<s2shapeutil::ShapeEdgeId_const*,std::vector<s2shapeutil::ShapeEdgeId,std::allocator<s2shapeutil::ShapeEdgeId>>>
                *)&local_a8,&local_b0);
    std::vector<s2shapeutil::ShapeEdgeId,_std::allocator<s2shapeutil::ShapeEdgeId>_>::erase
              (pvVar1,local_88,local_a8);
  }
  return;
}

Assistant:

void S2CrossingEdgeQuery::GetCandidates(const S2Point& a0, const S2Point& a1,
                                        const S2Shape& shape,
                                        vector<ShapeEdgeId>* edges) {
  edges->clear();
  int num_edges = shape.num_edges();
  if (num_edges <= kMaxBruteForceEdges) {
    edges->reserve(num_edges);
  }
  VisitRawCandidates(a0, a1, shape, [edges](ShapeEdgeId id) {
      edges->push_back(id);
      return true;
    });
  if (edges->size() > 1) {
    std::sort(edges->begin(), edges->end());
    edges->erase(std::unique(edges->begin(), edges->end()), edges->end());
  }
}